

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O2

bool __thiscall
BinaryModelSerialiser::saveModel(BinaryModelSerialiser *this,QByteArray *destination)

{
  AbstractModelSerialiserPrivate *this_00;
  bool bVar1;
  QDataStream witer;
  
  if ((destination == (QByteArray *)0x0) ||
     (this_00 = (this->super_AbstractModelSerialiser).d_ptr.d,
     this_00->m_constModel == (QAbstractItemModel *)0x0)) {
    bVar1 = false;
  }
  else {
    QDataStream::QDataStream(&witer,destination,2);
    bVar1 = BinaryModelSerialiserPrivate::writeBinary
                      ((BinaryModelSerialiserPrivate *)this_00,&witer);
    QDataStream::~QDataStream(&witer);
  }
  return bVar1;
}

Assistant:

bool BinaryModelSerialiser::saveModel(QByteArray *destination) const
{
    if (!destination)
        return false;
    Q_D(const BinaryModelSerialiser);

    if (!d->m_constModel)
        return false;
    QDataStream witer(destination, QIODevice::WriteOnly);
    witer.setVersion(d->m_streamVersion);
    return d->writeBinary(witer);
}